

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O1

void __thiscall OpenMD::LangevinPiston::evolveEtaB(LangevinPiston *this)

{
  result_type_conflict1 rVar1;
  
  this->prevEta = this->eta;
  rVar1 = std::normal_distribution<double>::operator()
                    (&this->forceDistribution_,
                     (this->randNumGen_).
                     super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&(this->forceDistribution_)._M_param);
  this->randomForce_ = rVar1;
  this->eta = (((((this->super_NPT).instaPress - (this->super_NPT).targetPressure) *
                (this->super_NPT).instaVol) / (this->W_ * 163882576.0) - this->gamma_ * this->eta) +
              rVar1 / this->W_) *
              (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 + this->oldEta;
  return;
}

Assistant:

void LangevinPiston::evolveEtaB() {
    prevEta = eta;

    genRandomForce(randomForce_);

    eta = oldEta + dt2 * (instaVol * (instaPress - targetPressure) /
                              (Constants::pressureConvert * W_) -
                          gamma_ * eta + randomForce_ / W_);
  }